

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::MaxLayerParams::_InternalSerialize
          (MaxLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong uVar1;
  void *data;
  uint8_t *puVar2;
  undefined8 *puVar3;
  size_t __n;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    data = *(void **)((uVar1 & 0xfffffffffffffffc) + 8);
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 1) == 0) {
      puVar3 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar3 = (undefined8 *)((uVar1 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar3[1];
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar3[1],target);
      return puVar2;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* MaxLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MaxLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MaxLayerParams)
  return target;
}